

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directory.cpp
# Opt level: O1

ssize_t __thiscall Directory::read(Directory *this,int __fd,void *__buf,size_t __nbytes)

{
  char *__name;
  usize minCapacity;
  usize *puVar1;
  uchar uVar2;
  bool bVar3;
  String *pSVar4;
  int iVar5;
  int iVar6;
  char *__pattern;
  int *piVar7;
  dirent *pdVar8;
  undefined4 extraout_var;
  size_t sVar10;
  char *__file;
  Data *extraout_RAX;
  Data *extraout_RAX_00;
  undefined4 in_register_00000034;
  String path;
  stat buff;
  String local_100;
  char *local_d8;
  String *local_d0;
  String *local_c8;
  stat local_c0;
  Data *pDVar9;
  
  local_c8 = (String *)CONCAT44(in_register_00000034,__fd);
  if (this->dp == (void *)0x0) {
    piVar7 = __errno_location();
    *piVar7 = 0x16;
  }
  else {
    __pattern = String::operator_cast_to_char_(&this->pattern);
    piVar7 = __errno_location();
    *piVar7 = 0;
    local_d0 = &this->dirpath;
    local_d8 = (char *)__buf;
    do {
      pdVar8 = readdir((DIR *)this->dp);
      if (pdVar8 == (dirent *)0x0) {
        iVar6 = 2;
        pDVar9 = (Data *)0x0;
      }
      else {
        __name = pdVar8->d_name;
        if (*__pattern != '\0') {
          iVar6 = 0;
          iVar5 = fnmatch(__pattern,__name,0);
          pDVar9 = (Data *)CONCAT44(extraout_var,iVar5);
          if (iVar5 != 0) goto LAB_00109204;
        }
        pSVar4 = local_d0;
        uVar2 = pdVar8->d_type;
        *(bool *)__buf = uVar2 == '\x04';
        if ((this->dirsOnly == true) && (uVar2 != '\x04')) {
LAB_00109082:
          pDVar9 = (Data *)0x0;
          iVar6 = 3;
        }
        else {
          if ((uVar2 != '\x04') && ((uVar2 == '\n' || (uVar2 == '\0')))) {
            String::String(&local_100,local_d0);
            if (pSVar4->data->len != 0) {
              minCapacity = (local_100.data)->len + 1;
              String::detach(&local_100,(local_100.data)->len,minCapacity);
              (local_100.data)->str[(local_100.data)->len] = '/';
              (local_100.data)->len = minCapacity;
              (local_100.data)->str[minCapacity] = '\0';
            }
            sVar10 = strlen(__name);
            String::append(&local_100,__name,sVar10);
            __file = String::operator_cast_to_char_(&local_100);
            iVar6 = stat(__file,&local_c0);
            if ((iVar6 == 0) && ((local_c0.st_mode & 0xf000) == 0x4000)) {
              *(char *)__buf = '\x01';
LAB_0010915c:
              iVar6 = 0;
              bVar3 = true;
            }
            else {
              if (this->dirsOnly == false) goto LAB_0010915c;
              iVar6 = 3;
              bVar3 = false;
            }
            pDVar9 = local_100.data;
            if ((local_100.data)->ref != 0) {
              LOCK();
              puVar1 = &(local_100.data)->ref;
              *puVar1 = *puVar1 - 1;
              UNLOCK();
              if ((*puVar1 == 0) && (local_100.data != (Data *)0x0)) {
                operator_delete__(local_100.data);
                pDVar9 = extraout_RAX;
              }
            }
            __buf = local_d8;
            if (!bVar3) goto LAB_00109204;
          }
          if ((*__buf == '\x01') && (*__name == '.')) {
            pDVar9 = (Data *)0x0;
            if (pdVar8->d_name[1] == '\0') goto LAB_00109082;
            if ((pdVar8->d_name[1] == '.') && (iVar6 = 3, pdVar8->d_name[2] == '\0'))
            goto LAB_00109204;
          }
          sVar10 = strlen(__name);
          String::String((String *)&local_c0,__name,sVar10);
          String::operator=(local_c8,(String *)&local_c0);
          pDVar9 = (Data *)local_c0.st_dev;
          if (*(usize *)(local_c0.st_dev + 0x18) != 0) {
            LOCK();
            puVar1 = (usize *)(local_c0.st_dev + 0x18);
            *puVar1 = *puVar1 - 1;
            UNLOCK();
            if ((*puVar1 == 0) && ((Data *)local_c0.st_dev != (Data *)0x0)) {
              operator_delete__((void *)local_c0.st_dev);
              pDVar9 = extraout_RAX_00;
            }
          }
          iVar6 = 1;
        }
      }
LAB_00109204:
    } while ((iVar6 == 0) || (iVar6 == 3));
    if (iVar6 != 2) {
      return CONCAT71((int7)((ulong)pDVar9 >> 8),1);
    }
  }
  return 0;
}

Assistant:

bool Directory::read(String& name, bool& isDir)
{
#ifdef _WIN32
  if(!findFile)
  {
    SetLastError(ERROR_INVALID_HANDLE);
    return false;
  }
  for(;;)
  {
    if(bufferedEntry)
      bufferedEntry = false;
    else if(!FindNextFile((HANDLE)findFile, (LPWIN32_FIND_DATA)ffd))
    {
      DWORD lastError = GetLastError();
      FindClose((HANDLE)findFile);
      findFile = INVALID_HANDLE_VALUE;
      SetLastError(lastError);
      return false;
    }
    isDir = (((LPWIN32_FIND_DATA)ffd)->dwFileAttributes & FILE_ATTRIBUTE_DIRECTORY) == FILE_ATTRIBUTE_DIRECTORY;
    if(dirsOnly && !isDir)
      continue;
    const char* str = ((LPWIN32_FIND_DATA)ffd)->cFileName;
    if(isDir && *str == '.' && (str[1] == '\0' || (str[1] == '.' && str[2] == '\0')))
      continue;

    if(!pattern.isEmpty())
    {
      struct PatternMatcher
      {
        static bool szWildMatch7(const char* pat, const char* str) {
            const char* s, * p;
            bool star = false;

        loopStart:
            for (s = str, p = pat; *s; ++s, ++p) {
              switch (*p) {
                  case '?':
                    break;
                  case '*':
                    star = true;
                    str = s, pat = p;
                    do { ++pat; } while (*pat == '*');
                    if (!*pat) return true;
                    goto loopStart;
                  default:
                    if (String::toLowerCase(*s) != String::toLowerCase(*p)) goto starCheck;
                    break;
              }
            }
            while (*p == '*') ++p;
            return !*p;
   
        starCheck:
            if (!star) return false;
            str++;
            goto loopStart;
        }
      };

      if(!PatternMatcher::szWildMatch7(pattern, str))
        continue;
    }

    name = String(str, (uint)strlen(str));
    return true;
  }
#else
  if(!dp)
  {
    errno = EINVAL;
    return false;
  }

  const char* pattern = this->pattern;
  errno = 0;
  for(;;)
  {
    struct dirent* dent = readdir((DIR*)dp);
    if(!dent)
      break;
    const char* const str = dent->d_name;
    if(!*pattern || fnmatch(pattern, str, 0) == 0)
    {
      isDir = dent->d_type == DT_DIR;
      if(dirsOnly && !isDir)
        continue;
      if(!isDir && (dent->d_type == DT_LNK || dent->d_type == DT_UNKNOWN))
      {
        String path = dirpath;
        if(!dirpath.isEmpty())
          path.append('/');
        path.append(str, strlen(str));
        struct stat buff;
        if(stat(path, &buff) == 0 && S_ISDIR(buff.st_mode))
          isDir = true;
        else if(dirsOnly)
          continue;
      }
      if(isDir && *str == '.' && (str[1] == '\0' || (str[1] == '.' && str[2] == '\0')))
        continue;
      name = String(str, strlen(str));
      return true;
    }
  }
  return false;
#endif
}